

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_comparator.cpp
# Opt level: O0

int bidfx_public_api::price::subject::SubjectComparatorUtils::Compare(Subject *a,Subject *b)

{
  Subject *pSVar1;
  int iVar2;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_68;
  string local_48;
  int local_24;
  Subject *pSStack_20;
  int cmp;
  Subject *b_local;
  Subject *a_local;
  
  pSStack_20 = b;
  b_local = a;
  std::__cxx11::string::string((string *)&local_68,(string *)SubjectKey::SYMBOL_abi_cxx11_);
  Subject::GetComponent(&local_48,a,&local_68);
  pSVar1 = pSStack_20;
  std::__cxx11::string::string((string *)&local_b8,(string *)SubjectKey::SYMBOL_abi_cxx11_);
  Subject::GetComponent(&local_98,pSVar1,&local_b8);
  iVar2 = CompareStrings(&local_48,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  pSVar1 = b_local;
  local_24 = iVar2;
  if (iVar2 == 0) {
    std::__cxx11::string::string((string *)&local_f8,(string *)SubjectKey::QUANTITY_abi_cxx11_);
    Subject::GetComponent(&local_d8,pSVar1,&local_f8);
    pSVar1 = pSStack_20;
    std::__cxx11::string::string((string *)&local_138,(string *)SubjectKey::QUANTITY_abi_cxx11_);
    Subject::GetComponent(&local_118,pSVar1,&local_138);
    local_24 = CompareQuantity(&local_d8,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    if (local_24 == 0) {
      iVar2 = Subject::Compare(b_local,pSStack_20);
      return iVar2;
    }
  }
  return local_24;
}

Assistant:

int SubjectComparatorUtils::Compare(const Subject& a, const Subject& b)
{
    int cmp = SubjectComparatorUtils::CompareStrings(a.GetComponent(SubjectKey::SYMBOL),
                                                     b.GetComponent(SubjectKey::SYMBOL));

    if (cmp == 0)
    {
        cmp = SubjectComparatorUtils::CompareQuantity(a.GetComponent(SubjectKey::QUANTITY),
                                                      b.GetComponent(SubjectKey::QUANTITY));
        if (cmp == 0)
        {
            return a.Compare(b);
        }
    }

    return cmp;
}